

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O3

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  undefined1 (*pauVar9) [32];
  uint uVar10;
  undefined1 (*pauVar11) [32];
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar17 [32];
  
  uVar4 = b->c;
  uVar10 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,(Allocator *)opt);
  iVar12 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        pauVar9 = (undefined1 (*) [32])(b->cstep * uVar8 * b->elemsize + (long)b->data);
        pauVar11 = (undefined1 (*) [32])(c->cstep * uVar8 * c->elemsize + (long)c->data);
        fVar1 = *a->data;
        auVar16._4_4_ = fVar1;
        auVar16._0_4_ = fVar1;
        auVar16._8_4_ = fVar1;
        auVar16._12_4_ = fVar1;
        auVar17._16_4_ = fVar1;
        auVar17._0_16_ = auVar16;
        auVar17._20_4_ = fVar1;
        auVar17._24_4_ = fVar1;
        auVar17._28_4_ = fVar1;
        if ((int)uVar10 < 8) {
          uVar13 = 0;
        }
        else {
          iVar12 = 7;
          auVar21 = in_ZMM3;
          do {
            auVar3 = *pauVar9;
            auVar6 = vrcpps_avx(auVar3);
            auVar22._0_4_ = fVar1 * auVar6._0_4_;
            auVar22._4_4_ = fVar1 * auVar6._4_4_;
            auVar22._8_4_ = fVar1 * auVar6._8_4_;
            auVar22._12_4_ = fVar1 * auVar6._12_4_;
            auVar22._16_4_ = fVar1 * auVar6._16_4_;
            auVar22._20_4_ = fVar1 * auVar6._20_4_;
            auVar22._28_36_ = auVar21._28_36_;
            auVar22._24_4_ = fVar1 * auVar6._24_4_;
            in_ZMM3 = ZEXT3264(auVar22._0_32_);
            auVar7._4_4_ = auVar3._4_4_ * auVar22._4_4_;
            auVar7._0_4_ = auVar3._0_4_ * auVar22._0_4_;
            auVar7._8_4_ = auVar3._8_4_ * auVar22._8_4_;
            auVar7._12_4_ = auVar3._12_4_ * auVar22._12_4_;
            auVar7._16_4_ = auVar3._16_4_ * auVar22._16_4_;
            auVar7._20_4_ = auVar3._20_4_ * auVar22._20_4_;
            auVar7._24_4_ = auVar3._24_4_ * auVar22._24_4_;
            auVar7._28_4_ = auVar3._28_4_;
            auVar3 = vsubps_avx(auVar17,auVar7);
            auVar18._0_4_ = auVar22._0_4_ + auVar6._0_4_ * auVar3._0_4_;
            auVar18._4_4_ = auVar22._4_4_ + auVar6._4_4_ * auVar3._4_4_;
            auVar18._8_4_ = auVar22._8_4_ + auVar6._8_4_ * auVar3._8_4_;
            auVar18._12_4_ = auVar22._12_4_ + auVar6._12_4_ * auVar3._12_4_;
            auVar18._16_4_ = auVar22._16_4_ + auVar6._16_4_ * auVar3._16_4_;
            auVar18._20_4_ = auVar22._20_4_ + auVar6._20_4_ * auVar3._20_4_;
            auVar18._24_4_ = auVar22._24_4_ + auVar6._24_4_ * auVar3._24_4_;
            auVar18._28_4_ = auVar21._28_4_ + auVar3._28_4_;
            *pauVar11 = auVar18;
            pauVar9 = pauVar9 + 1;
            pauVar11 = pauVar11 + 1;
            iVar12 = iVar12 + 8;
            auVar21 = in_ZMM3;
            uVar13 = uVar10 & 0xfffffff8;
          } while (iVar12 < (int)uVar10);
        }
        if ((int)(uVar13 | 3) < (int)uVar10) {
          auVar16 = vshufps_avx(auVar16,auVar16,0);
          uVar14 = uVar13;
          do {
            auVar2 = *(undefined1 (*) [16])*pauVar9;
            auVar5 = vrcpps_avx(auVar2);
            in_ZMM3 = ZEXT1664(auVar5);
            fVar23 = auVar16._0_4_ * auVar5._0_4_;
            fVar24 = auVar16._4_4_ * auVar5._4_4_;
            fVar25 = auVar16._8_4_ * auVar5._8_4_;
            fVar26 = auVar16._12_4_ * auVar5._12_4_;
            auVar19._0_4_ = auVar2._0_4_ * fVar23;
            auVar19._4_4_ = auVar2._4_4_ * fVar24;
            auVar19._8_4_ = auVar2._8_4_ * fVar25;
            auVar19._12_4_ = auVar2._12_4_ * fVar26;
            auVar2 = vsubps_avx(auVar16,auVar19);
            auVar20._0_4_ = fVar23 + auVar5._0_4_ * auVar2._0_4_;
            auVar20._4_4_ = fVar24 + auVar5._4_4_ * auVar2._4_4_;
            auVar20._8_4_ = fVar25 + auVar5._8_4_ * auVar2._8_4_;
            auVar20._12_4_ = fVar26 + auVar5._12_4_ * auVar2._12_4_;
            *(undefined1 (*) [16])*pauVar11 = auVar20;
            pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
            pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
            uVar13 = uVar14 + 4;
            iVar12 = uVar14 + 7;
            uVar14 = uVar13;
          } while (iVar12 < (int)uVar10);
        }
        if (uVar10 - uVar13 != 0 && (int)uVar13 <= (int)uVar10) {
          lVar15 = 0;
          do {
            *(float *)((long)*pauVar11 + lVar15 * 4) = fVar1 / *(float *)(*pauVar9 + lVar15 * 4);
            lVar15 = lVar15 + 1;
          } while (uVar10 - uVar13 != (int)lVar15);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar4);
    }
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}